

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_nnquant.c
# Opt level: O3

void initnet(nn_quant *nnq,uchar *thepic,int len,int sample,int colours)

{
  int iVar1;
  ulong uVar2;
  int *piVar3;
  nq_pixel *__s;
  
  __s = nnq->network;
  memset(__s,0,0x1400);
  nnq->thepicture = thepic;
  nnq->lengthcount = len;
  nnq->samplefac = sample;
  nnq->netsize = colours;
  if (0 < colours) {
    uVar2 = 0;
    piVar3 = nnq->freq;
    do {
      iVar1 = (int)((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) /
                   (long)colours);
      (*__s)[0] = iVar1;
      (*__s)[1] = iVar1;
      (*__s)[2] = iVar1;
      (*__s)[3] = iVar1;
      *piVar3 = (int)(0x10000 / (ulong)(uint)colours);
      piVar3[-0x100] = 0;
      uVar2 = uVar2 + 0x1000;
      piVar3 = piVar3 + 1;
      __s = __s + 1;
    } while ((ulong)(uint)colours << 0xc != uVar2);
  }
  return;
}

Assistant:

void initnet(nnq, thepic, len, sample, colours)
nn_quant *nnq;
unsigned char *thepic;
int len;
int sample;
int colours;
{
	register int i;
	register int *p;

	/* Clear out network from previous runs */
	/* thanks to Chen Bin for this fix */
	memset((void*)nnq->network, 0, sizeof(nq_pixel)*MAXNETSIZE);

	nnq->thepicture = thepic;
	nnq->lengthcount = len;
	nnq->samplefac = sample;
	nnq->netsize = colours;

	for (i=0; i < nnq->netsize; i++) {
		p = nnq->network[i];
		p[0] = p[1] = p[2] = p[3] = (i << (netbiasshift+8)) / nnq->netsize;
		nnq->freq[i] = intbias / nnq->netsize;	/* 1/netsize */
		nnq->bias[i] = 0;
	}
}